

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::
EventsProcessorLeftMouseButtonUpEventTests(EventsProcessorLeftMouseButtonUpEventTests *this)

{
  MockSpec<solitaire::interfaces::Solitaire_&()> *this_00;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_01;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_02;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_03;
  MockSpec<solitaire::geometry::Position_()> *this_04;
  TypedExpectation<solitaire::geometry::Position_()> *this_05;
  ContextMock *pCVar1;
  SolitaireMock *this_06;
  ReturnAction<solitaire::geometry::Position> local_100;
  Action<solitaire::geometry::Position_()> local_f0;
  WithoutMatchers local_c9;
  MockSpec<solitaire::geometry::Position_()> local_c8;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *local_b8;
  undefined1 local_b0 [40];
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_88;
  StrictMock<solitaire::SolitaireMock> *local_78;
  undefined1 local_70 [40];
  MockSpec<solitaire::interfaces::Solitaire_&()> local_48;
  MouseLeftButtonUp local_31;
  undefined1 local_30 [32];
  EventsProcessorLeftMouseButtonUpEventTests *local_10;
  EventsProcessorLeftMouseButtonUpEventTests *this_local;
  
  local_10 = this;
  EventsProcessorTests::EventsProcessorTests(&this->super_EventsProcessorTests);
  (this->super_EventsProcessorTests).super_Test._vptr_Test =
       (_func_int **)&PTR__EventsProcessorLeftMouseButtonUpEventTests_00501c58;
  std::allocator<solitaire::cards::Card>::allocator
            ((allocator<solitaire::cards::Card> *)(local_30 + 0x1f));
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->cardsInHand,5,(allocator<solitaire::cards::Card> *)(local_30 + 0x1f));
  std::allocator<solitaire::cards::Card>::~allocator
            ((allocator<solitaire::cards::Card> *)(local_30 + 0x1f));
  pCVar1 = (ContextMock *)local_30;
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::
  variant<solitaire::events::MouseLeftButtonUp,void,void,solitaire::events::MouseLeftButtonUp,void>
            ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
              *)pCVar1,&local_31);
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)pCVar1);
  local_48.function_mocker_ =
       (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
       ContextMock::gmock_getSolitaire
                 ((MockSpec<solitaire::interfaces::Solitaire_&()> *)
                  &(this->super_EventsProcessorTests).contextMock,pCVar1);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::operator()
                      (&local_48,(WithoutMatchers *)(local_70 + 0x27),(void *)0x0);
  this_01 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x171,"contextMock","getSolitaire()");
  local_78 = (StrictMock<solitaire::SolitaireMock> *)
             testing::ReturnRef<testing::StrictMock<solitaire::SolitaireMock>>
                       (&(this->super_EventsProcessorTests).solitaireMock);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)local_70,(ReturnRefAction *)&local_78);
  this_06 = (SolitaireMock *)local_70;
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_01,(Action<solitaire::interfaces::Solitaire_&()> *)this_06);
  testing::Action<solitaire::interfaces::Solitaire_&()>::~Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)local_70);
  local_88.function_mocker_ =
       (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *)SolitaireMock::gmock_getCardsInHand
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)&(this->super_EventsProcessorTests).solitaireMock,this_06);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::operator()(&local_88,(WithoutMatchers *)(local_b0 + 0x27),(void *)0x0);
  this_03 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x172,"solitaireMock","getCardsInHand()");
  local_b8 = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             testing::
             ReturnRef<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
                       (&this->cardsInHand);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
              *)local_b0,(ReturnRefAction *)&local_b8);
  pCVar1 = (ContextMock *)local_b0;
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_03,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)pCVar1);
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  ~Action((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
           *)local_b0);
  local_c8.function_mocker_ =
       (FunctionMocker<solitaire::geometry::Position_()> *)
       ContextMock::gmock_getCardsInHandPosition
                 ((MockSpec<solitaire::geometry::Position_()> *)
                  &(this->super_EventsProcessorTests).contextMock,pCVar1);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<solitaire::geometry::Position_()>::operator()
                      (&local_c8,&local_c9,(void *)0x0);
  this_05 = testing::internal::MockSpec<solitaire::geometry::Position_()>::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x173,"contextMock","getCardsInHandPosition()");
  testing::Return<solitaire::geometry::Position>((testing *)&local_100,(Position)0x1a0000002e);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
  testing::internal::TypedExpectation<solitaire::geometry::Position_()>::WillOnce(this_05,&local_f0)
  ;
  testing::Action<solitaire::geometry::Position_()>::~Action(&local_f0);
  testing::internal::ReturnAction<solitaire::geometry::Position>::~ReturnAction(&local_100);
  return;
}

Assistant:

EventsProcessorLeftMouseButtonUpEventTests() {
        expectEvent(MouseLeftButtonUp {});
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, getCardsInHand()).WillOnce(ReturnRef(cardsInHand));
        EXPECT_CALL(contextMock, getCardsInHandPosition()).WillOnce(Return(cardsInHandPosition));
    }